

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMessageClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  char *text;
  
  pFVar1 = this->descriptor_;
  if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) == 3) {
    if (*(char *)(*(long *)(*(long *)(pFVar1 + 0x30) + 0xa0) + 0xa7) != '\x01') {
      if (*(long *)(*(long *)(pFVar1 + 0xa0) + 8) == 0) {
        text = "$name$_.ClearToEmptyNoArena($default_variable$);\n";
      }
      else {
        text = "$name$_.ClearToDefaultNoArena($default_variable$);\n";
      }
      goto LAB_0028c27a;
    }
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "GOOGLE_DCHECK(!$name$_.IsDefault($default_variable$));\n");
    pFVar1 = this->descriptor_;
    if (*(char *)(*(long *)(*(long *)(pFVar1 + 0x30) + 0xa0) + 0xa7) == '\0') {
      if (*(long *)(*(long *)(pFVar1 + 0xa0) + 8) == 0) {
        text = "(*$name$_.UnsafeRawStringPointer())->clear();\n";
      }
      else {
        text = "(*$name$_.UnsafeRawStringPointer())->assign(*$default_variable$);\n";
      }
      goto LAB_0028c27a;
    }
  }
  if (*(long *)(*(long *)(pFVar1 + 0xa0) + 8) == 0) {
    text = "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n";
  }
  else {
    text = "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n";
  }
LAB_0028c27a:
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMessageClearingCode(io::Printer* printer) const {
  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have field presence, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against default_variable.
  const bool must_be_present = HasFieldPresence(descriptor_->file());

  if (must_be_present) {
    printer->Print(variables_,
      "GOOGLE_DCHECK(!$name$_.IsDefault($default_variable$));\n");
  }

  if (SupportsArenas(descriptor_)) {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
  } else if (must_be_present) {
    // When Arenas are disabled and field presence has been checked, we can
    // safely treat the ArenaStringPtr as a string*.
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "(*$name$_.UnsafeRawStringPointer())->clear();\n");
    } else {
      printer->Print(variables_,
        "(*$name$_.UnsafeRawStringPointer())->assign(*$default_variable$);\n");
    }
  } else {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
  }
}